

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O0

int mbedtls_internal_sha256_process(mbedtls_sha256_context *ctx,uchar *data)

{
  uint32_t uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long in_RSI;
  long in_RDI;
  uint i;
  anon_struct_296_4_ace97671 local;
  uint32_t r;
  size_t in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  uint uVar7;
  uint auStack_140 [77];
  uint local_c;
  uint *local_8;
  
  for (uVar7 = 0; uVar7 < 8; uVar7 = uVar7 + 1) {
    auStack_140[(ulong)uVar7 + 0x40] = *(uint *)(in_RDI + 0x48 + (ulong)uVar7 * 4);
  }
  for (uVar7 = 0; uVar7 < 0x10; uVar7 = uVar7 + 1) {
    local_8 = (uint *)(in_RSI + (ulong)(uVar7 << 2));
    local_c = *local_8;
    auStack_140[uVar7] =
         local_c >> 0x18 | (local_c & 0xff0000) >> 8 | (local_c & 0xff00) << 8 | local_c << 0x18;
  }
  for (uVar7 = 0; uVar7 < 0x10; uVar7 = uVar7 + 8) {
    iVar2 = auStack_140[0x47] +
            ((auStack_140[0x44] >> 6 | auStack_140[0x44] << 0x1a) ^
             (auStack_140[0x44] >> 0xb | auStack_140[0x44] << 0x15) ^
            (auStack_140[0x44] >> 0x19 | auStack_140[0x44] << 7)) +
            (auStack_140[0x46] ^ auStack_140[0x44] & (auStack_140[0x45] ^ auStack_140[0x46])) +
            K[uVar7] + auStack_140[uVar7];
    auStack_140[0x43] = iVar2 + auStack_140[0x43];
    auStack_140[0x47] =
         iVar2 + ((auStack_140[0x40] >> 2 | auStack_140[0x40] << 0x1e) ^
                  (auStack_140[0x40] >> 0xd | auStack_140[0x40] << 0x13) ^
                 (auStack_140[0x40] >> 0x16 | auStack_140[0x40] << 10)) +
                 (auStack_140[0x40] & auStack_140[0x41] |
                 auStack_140[0x42] & (auStack_140[0x40] | auStack_140[0x41]));
    iVar2 = auStack_140[0x46] +
            ((auStack_140[0x43] >> 6 | auStack_140[0x43] * 0x4000000) ^
             (auStack_140[0x43] >> 0xb | auStack_140[0x43] * 0x200000) ^
            (auStack_140[0x43] >> 0x19 | auStack_140[0x43] * 0x80)) +
            (auStack_140[0x45] ^ auStack_140[0x43] & (auStack_140[0x44] ^ auStack_140[0x45])) +
            K[uVar7 + 1] + auStack_140[uVar7 + 1];
    auStack_140[0x42] = iVar2 + auStack_140[0x42];
    auStack_140[0x46] =
         iVar2 + ((auStack_140[0x47] >> 2 | auStack_140[0x47] * 0x40000000) ^
                  (auStack_140[0x47] >> 0xd | auStack_140[0x47] * 0x80000) ^
                 (auStack_140[0x47] >> 0x16 | auStack_140[0x47] * 0x400)) +
                 (auStack_140[0x47] & auStack_140[0x40] |
                 auStack_140[0x41] & (auStack_140[0x47] | auStack_140[0x40]));
    iVar2 = auStack_140[0x45] +
            ((auStack_140[0x42] >> 6 | auStack_140[0x42] * 0x4000000) ^
             (auStack_140[0x42] >> 0xb | auStack_140[0x42] * 0x200000) ^
            (auStack_140[0x42] >> 0x19 | auStack_140[0x42] * 0x80)) +
            (auStack_140[0x44] ^ auStack_140[0x42] & (auStack_140[0x43] ^ auStack_140[0x44])) +
            K[uVar7 + 2] + auStack_140[uVar7 + 2];
    auStack_140[0x41] = iVar2 + auStack_140[0x41];
    auStack_140[0x45] =
         iVar2 + ((auStack_140[0x46] >> 2 | auStack_140[0x46] * 0x40000000) ^
                  (auStack_140[0x46] >> 0xd | auStack_140[0x46] * 0x80000) ^
                 (auStack_140[0x46] >> 0x16 | auStack_140[0x46] * 0x400)) +
                 (auStack_140[0x46] & auStack_140[0x47] |
                 auStack_140[0x40] & (auStack_140[0x46] | auStack_140[0x47]));
    iVar2 = auStack_140[0x44] +
            ((auStack_140[0x41] >> 6 | auStack_140[0x41] * 0x4000000) ^
             (auStack_140[0x41] >> 0xb | auStack_140[0x41] * 0x200000) ^
            (auStack_140[0x41] >> 0x19 | auStack_140[0x41] * 0x80)) +
            (auStack_140[0x43] ^ auStack_140[0x41] & (auStack_140[0x42] ^ auStack_140[0x43])) +
            K[uVar7 + 3] + auStack_140[uVar7 + 3];
    auStack_140[0x40] = iVar2 + auStack_140[0x40];
    auStack_140[0x44] =
         iVar2 + ((auStack_140[0x45] >> 2 | auStack_140[0x45] * 0x40000000) ^
                  (auStack_140[0x45] >> 0xd | auStack_140[0x45] * 0x80000) ^
                 (auStack_140[0x45] >> 0x16 | auStack_140[0x45] * 0x400)) +
                 (auStack_140[0x45] & auStack_140[0x46] |
                 auStack_140[0x47] & (auStack_140[0x45] | auStack_140[0x46]));
    iVar2 = auStack_140[0x43] +
            ((auStack_140[0x40] >> 6 | auStack_140[0x40] * 0x4000000) ^
             (auStack_140[0x40] >> 0xb | auStack_140[0x40] * 0x200000) ^
            (auStack_140[0x40] >> 0x19 | auStack_140[0x40] * 0x80)) +
            (auStack_140[0x42] ^ auStack_140[0x40] & (auStack_140[0x41] ^ auStack_140[0x42])) +
            K[uVar7 + 4] + auStack_140[uVar7 + 4];
    auStack_140[0x47] = iVar2 + auStack_140[0x47];
    auStack_140[0x43] =
         iVar2 + ((auStack_140[0x44] >> 2 | auStack_140[0x44] * 0x40000000) ^
                  (auStack_140[0x44] >> 0xd | auStack_140[0x44] * 0x80000) ^
                 (auStack_140[0x44] >> 0x16 | auStack_140[0x44] * 0x400)) +
                 (auStack_140[0x44] & auStack_140[0x45] |
                 auStack_140[0x46] & (auStack_140[0x44] | auStack_140[0x45]));
    iVar2 = auStack_140[0x42] +
            ((auStack_140[0x47] >> 6 | auStack_140[0x47] * 0x4000000) ^
             (auStack_140[0x47] >> 0xb | auStack_140[0x47] * 0x200000) ^
            (auStack_140[0x47] >> 0x19 | auStack_140[0x47] * 0x80)) +
            (auStack_140[0x41] ^ auStack_140[0x47] & (auStack_140[0x40] ^ auStack_140[0x41])) +
            K[uVar7 + 5] + auStack_140[uVar7 + 5];
    auStack_140[0x46] = iVar2 + auStack_140[0x46];
    auStack_140[0x42] =
         iVar2 + ((auStack_140[0x43] >> 2 | auStack_140[0x43] * 0x40000000) ^
                  (auStack_140[0x43] >> 0xd | auStack_140[0x43] * 0x80000) ^
                 (auStack_140[0x43] >> 0x16 | auStack_140[0x43] * 0x400)) +
                 (auStack_140[0x43] & auStack_140[0x44] |
                 auStack_140[0x45] & (auStack_140[0x43] | auStack_140[0x44]));
    iVar2 = auStack_140[0x41] +
            ((auStack_140[0x46] >> 6 | auStack_140[0x46] * 0x4000000) ^
             (auStack_140[0x46] >> 0xb | auStack_140[0x46] * 0x200000) ^
            (auStack_140[0x46] >> 0x19 | auStack_140[0x46] * 0x80)) +
            (auStack_140[0x40] ^ auStack_140[0x46] & (auStack_140[0x47] ^ auStack_140[0x40])) +
            K[uVar7 + 6] + auStack_140[uVar7 + 6];
    auStack_140[0x45] = iVar2 + auStack_140[0x45];
    auStack_140[0x41] =
         iVar2 + ((auStack_140[0x42] >> 2 | auStack_140[0x42] * 0x40000000) ^
                  (auStack_140[0x42] >> 0xd | auStack_140[0x42] * 0x80000) ^
                 (auStack_140[0x42] >> 0x16 | auStack_140[0x42] * 0x400)) +
                 (auStack_140[0x42] & auStack_140[0x43] |
                 auStack_140[0x44] & (auStack_140[0x42] | auStack_140[0x43]));
    iVar2 = auStack_140[0x40] +
            ((auStack_140[0x45] >> 6 | auStack_140[0x45] * 0x4000000) ^
             (auStack_140[0x45] >> 0xb | auStack_140[0x45] * 0x200000) ^
            (auStack_140[0x45] >> 0x19 | auStack_140[0x45] * 0x80)) +
            (auStack_140[0x47] ^ auStack_140[0x45] & (auStack_140[0x46] ^ auStack_140[0x47])) +
            K[uVar7 + 7] + auStack_140[uVar7 + 7];
    auStack_140[0x44] = iVar2 + auStack_140[0x44];
    auStack_140[0x40] =
         iVar2 + ((auStack_140[0x41] >> 2 | auStack_140[0x41] * 0x40000000) ^
                  (auStack_140[0x41] >> 0xd | auStack_140[0x41] * 0x80000) ^
                 (auStack_140[0x41] >> 0x16 | auStack_140[0x41] * 0x400)) +
                 (auStack_140[0x41] & auStack_140[0x42] |
                 auStack_140[0x43] & (auStack_140[0x41] | auStack_140[0x42]));
  }
  for (uVar7 = 0x10; uVar7 < 0x40; uVar7 = uVar7 + 8) {
    uVar1 = K[uVar7];
    uVar3 = ((auStack_140[uVar7 - 2] >> 0x11 | auStack_140[uVar7 - 2] << 0xf) ^
             (auStack_140[uVar7 - 2] >> 0x13 | auStack_140[uVar7 - 2] << 0xd) ^
            auStack_140[uVar7 - 2] >> 10) + auStack_140[uVar7 - 7] +
            ((auStack_140[uVar7 - 0xf] >> 7 | auStack_140[uVar7 - 0xf] << 0x19) ^
             (auStack_140[uVar7 - 0xf] >> 0x12 | auStack_140[uVar7 - 0xf] << 0xe) ^
            auStack_140[uVar7 - 0xf] >> 3) + auStack_140[uVar7 - 0x10];
    auStack_140[uVar7] = uVar3;
    iVar2 = auStack_140[0x47] +
            ((auStack_140[0x44] >> 6 | auStack_140[0x44] << 0x1a) ^
             (auStack_140[0x44] >> 0xb | auStack_140[0x44] << 0x15) ^
            (auStack_140[0x44] >> 0x19 | auStack_140[0x44] << 7)) +
            (auStack_140[0x46] ^ auStack_140[0x44] & (auStack_140[0x45] ^ auStack_140[0x46])) +
            uVar1 + uVar3;
    uVar3 = iVar2 + auStack_140[0x43];
    auStack_140[0x43] = uVar3;
    auStack_140[0x47] =
         iVar2 + ((auStack_140[0x40] >> 2 | auStack_140[0x40] << 0x1e) ^
                  (auStack_140[0x40] >> 0xd | auStack_140[0x40] << 0x13) ^
                 (auStack_140[0x40] >> 0x16 | auStack_140[0x40] << 10)) +
                 (auStack_140[0x40] & auStack_140[0x41] |
                 auStack_140[0x42] & (auStack_140[0x40] | auStack_140[0x41]));
    uVar1 = K[uVar7 + 1];
    uVar4 = ((auStack_140[uVar7 - 1] >> 0x11 | auStack_140[uVar7 - 1] << 0xf) ^
             (auStack_140[uVar7 - 1] >> 0x13 | auStack_140[uVar7 - 1] << 0xd) ^
            auStack_140[uVar7 - 1] >> 10) + auStack_140[uVar7 - 6] +
            ((auStack_140[uVar7 - 0xe] >> 7 | auStack_140[uVar7 - 0xe] << 0x19) ^
             (auStack_140[uVar7 - 0xe] >> 0x12 | auStack_140[uVar7 - 0xe] << 0xe) ^
            auStack_140[uVar7 - 0xe] >> 3) + auStack_140[uVar7 - 0xf];
    auStack_140[uVar7 + 1] = uVar4;
    iVar2 = auStack_140[0x46] +
            ((uVar3 >> 6 | uVar3 * 0x4000000) ^ (uVar3 >> 0xb | uVar3 * 0x200000) ^
            (uVar3 >> 0x19 | uVar3 * 0x80)) +
            (auStack_140[0x45] ^ uVar3 & (auStack_140[0x44] ^ auStack_140[0x45])) + uVar1 + uVar4;
    uVar4 = iVar2 + auStack_140[0x42];
    auStack_140[0x42] = uVar4;
    auStack_140[0x46] =
         iVar2 + ((auStack_140[0x47] >> 2 | auStack_140[0x47] * 0x40000000) ^
                  (auStack_140[0x47] >> 0xd | auStack_140[0x47] * 0x80000) ^
                 (auStack_140[0x47] >> 0x16 | auStack_140[0x47] * 0x400)) +
                 (auStack_140[0x47] & auStack_140[0x40] |
                 auStack_140[0x41] & (auStack_140[0x47] | auStack_140[0x40]));
    uVar1 = K[uVar7 + 2];
    uVar5 = ((auStack_140[uVar7] >> 0x11 | auStack_140[uVar7] << 0xf) ^
             (auStack_140[uVar7] >> 0x13 | auStack_140[uVar7] << 0xd) ^ auStack_140[uVar7] >> 10) +
            auStack_140[uVar7 - 5] +
            ((auStack_140[uVar7 - 0xd] >> 7 | auStack_140[uVar7 - 0xd] << 0x19) ^
             (auStack_140[uVar7 - 0xd] >> 0x12 | auStack_140[uVar7 - 0xd] << 0xe) ^
            auStack_140[uVar7 - 0xd] >> 3) + auStack_140[uVar7 - 0xe];
    auStack_140[uVar7 + 2] = uVar5;
    iVar2 = auStack_140[0x45] +
            ((uVar4 >> 6 | uVar4 * 0x4000000) ^ (uVar4 >> 0xb | uVar4 * 0x200000) ^
            (uVar4 >> 0x19 | uVar4 * 0x80)) +
            (auStack_140[0x44] ^ uVar4 & (uVar3 ^ auStack_140[0x44])) + uVar1 + uVar5;
    uVar5 = iVar2 + auStack_140[0x41];
    auStack_140[0x41] = uVar5;
    auStack_140[0x45] =
         iVar2 + ((auStack_140[0x46] >> 2 | auStack_140[0x46] * 0x40000000) ^
                  (auStack_140[0x46] >> 0xd | auStack_140[0x46] * 0x80000) ^
                 (auStack_140[0x46] >> 0x16 | auStack_140[0x46] * 0x400)) +
                 (auStack_140[0x46] & auStack_140[0x47] |
                 auStack_140[0x40] & (auStack_140[0x46] | auStack_140[0x47]));
    uVar1 = K[uVar7 + 3];
    uVar6 = ((auStack_140[uVar7 + 1] >> 0x11 | auStack_140[uVar7 + 1] << 0xf) ^
             (auStack_140[uVar7 + 1] >> 0x13 | auStack_140[uVar7 + 1] << 0xd) ^
            auStack_140[uVar7 + 1] >> 10) + auStack_140[uVar7 - 4] +
            ((auStack_140[uVar7 - 0xc] >> 7 | auStack_140[uVar7 - 0xc] << 0x19) ^
             (auStack_140[uVar7 - 0xc] >> 0x12 | auStack_140[uVar7 - 0xc] << 0xe) ^
            auStack_140[uVar7 - 0xc] >> 3) + auStack_140[uVar7 - 0xd];
    auStack_140[uVar7 + 3] = uVar6;
    iVar2 = auStack_140[0x44] +
            ((uVar5 >> 6 | uVar5 * 0x4000000) ^ (uVar5 >> 0xb | uVar5 * 0x200000) ^
            (uVar5 >> 0x19 | uVar5 * 0x80)) + (uVar3 ^ uVar5 & (uVar4 ^ uVar3)) + uVar1 + uVar6;
    uVar4 = iVar2 + auStack_140[0x40];
    auStack_140[0x40] = uVar4;
    auStack_140[0x44] =
         iVar2 + ((auStack_140[0x45] >> 2 | auStack_140[0x45] * 0x40000000) ^
                  (auStack_140[0x45] >> 0xd | auStack_140[0x45] * 0x80000) ^
                 (auStack_140[0x45] >> 0x16 | auStack_140[0x45] * 0x400)) +
                 (auStack_140[0x45] & auStack_140[0x46] |
                 auStack_140[0x47] & (auStack_140[0x45] | auStack_140[0x46]));
    uVar5 = auStack_140[0x42] ^ uVar4 & (auStack_140[0x41] ^ auStack_140[0x42]);
    uVar1 = K[uVar7 + 4];
    uVar6 = ((auStack_140[uVar7 + 2] >> 0x11 | auStack_140[uVar7 + 2] << 0xf) ^
             (auStack_140[uVar7 + 2] >> 0x13 | auStack_140[uVar7 + 2] << 0xd) ^
            auStack_140[uVar7 + 2] >> 10) + auStack_140[uVar7 - 3] +
            ((auStack_140[uVar7 - 0xb] >> 7 | auStack_140[uVar7 - 0xb] << 0x19) ^
             (auStack_140[uVar7 - 0xb] >> 0x12 | auStack_140[uVar7 - 0xb] << 0xe) ^
            auStack_140[uVar7 - 0xb] >> 3) + auStack_140[uVar7 - 0xc];
    auStack_140[uVar7 + 4] = uVar6;
    iVar2 = uVar3 + ((uVar4 >> 6 | uVar4 * 0x4000000) ^ (uVar4 >> 0xb | uVar4 * 0x200000) ^
                    (uVar4 >> 0x19 | uVar4 * 0x80)) + uVar5 + uVar1 + uVar6;
    auStack_140[0x47] = iVar2 + auStack_140[0x47];
    auStack_140[0x43] =
         iVar2 + ((auStack_140[0x44] >> 2 | auStack_140[0x44] * 0x40000000) ^
                  (auStack_140[0x44] >> 0xd | auStack_140[0x44] * 0x80000) ^
                 (auStack_140[0x44] >> 0x16 | auStack_140[0x44] * 0x400)) +
                 (auStack_140[0x44] & auStack_140[0x45] |
                 auStack_140[0x46] & (auStack_140[0x44] | auStack_140[0x45]));
    uVar3 = auStack_140[0x41] ^ auStack_140[0x47] & (auStack_140[0x40] ^ auStack_140[0x41]);
    uVar1 = K[uVar7 + 5];
    uVar4 = ((auStack_140[uVar7 + 3] >> 0x11 | auStack_140[uVar7 + 3] << 0xf) ^
             (auStack_140[uVar7 + 3] >> 0x13 | auStack_140[uVar7 + 3] << 0xd) ^
            auStack_140[uVar7 + 3] >> 10) + auStack_140[uVar7 - 2] +
            ((auStack_140[uVar7 - 10] >> 7 | auStack_140[uVar7 - 10] << 0x19) ^
             (auStack_140[uVar7 - 10] >> 0x12 | auStack_140[uVar7 - 10] << 0xe) ^
            auStack_140[uVar7 - 10] >> 3) + auStack_140[uVar7 - 0xb];
    auStack_140[uVar7 + 5] = uVar4;
    iVar2 = auStack_140[0x42] +
            ((auStack_140[0x47] >> 6 | auStack_140[0x47] * 0x4000000) ^
             (auStack_140[0x47] >> 0xb | auStack_140[0x47] * 0x200000) ^
            (auStack_140[0x47] >> 0x19 | auStack_140[0x47] * 0x80)) + uVar3 + uVar1 + uVar4;
    uVar3 = iVar2 + auStack_140[0x46];
    auStack_140[0x46] = uVar3;
    auStack_140[0x42] =
         iVar2 + ((auStack_140[0x43] >> 2 | auStack_140[0x43] << 0x1e) ^
                  (auStack_140[0x43] >> 0xd | auStack_140[0x43] << 0x13) ^
                 (auStack_140[0x43] >> 0x16 | auStack_140[0x43] << 10)) +
                 (auStack_140[0x43] & auStack_140[0x44] |
                 auStack_140[0x45] & (auStack_140[0x43] | auStack_140[0x44]));
    uVar4 = auStack_140[0x40] ^ uVar3 & (auStack_140[0x47] ^ auStack_140[0x40]);
    uVar1 = K[uVar7 + 6];
    uVar5 = ((auStack_140[uVar7 + 4] >> 0x11 | auStack_140[uVar7 + 4] << 0xf) ^
             (auStack_140[uVar7 + 4] >> 0x13 | auStack_140[uVar7 + 4] << 0xd) ^
            auStack_140[uVar7 + 4] >> 10) + auStack_140[uVar7 - 1] +
            ((auStack_140[uVar7 - 9] >> 7 | auStack_140[uVar7 - 9] << 0x19) ^
             (auStack_140[uVar7 - 9] >> 0x12 | auStack_140[uVar7 - 9] << 0xe) ^
            auStack_140[uVar7 - 9] >> 3) + auStack_140[uVar7 - 10];
    auStack_140[uVar7 + 6] = uVar5;
    iVar2 = auStack_140[0x41] +
            ((uVar3 >> 6 | uVar3 * 0x4000000) ^ (uVar3 >> 0xb | uVar3 * 0x200000) ^
            (uVar3 >> 0x19 | uVar3 * 0x80)) + uVar4 + uVar1 + uVar5;
    uVar4 = iVar2 + auStack_140[0x45];
    auStack_140[0x45] = uVar4;
    auStack_140[0x41] =
         iVar2 + ((auStack_140[0x42] >> 2 | auStack_140[0x42] << 0x1e) ^
                  (auStack_140[0x42] >> 0xd | auStack_140[0x42] << 0x13) ^
                 (auStack_140[0x42] >> 0x16 | auStack_140[0x42] << 10)) +
                 (auStack_140[0x42] & auStack_140[0x43] |
                 auStack_140[0x44] & (auStack_140[0x42] | auStack_140[0x43]));
    uVar1 = K[uVar7 + 7];
    uVar5 = ((auStack_140[uVar7 + 5] >> 0x11 | auStack_140[uVar7 + 5] << 0xf) ^
             (auStack_140[uVar7 + 5] >> 0x13 | auStack_140[uVar7 + 5] << 0xd) ^
            auStack_140[uVar7 + 5] >> 10) + auStack_140[uVar7] +
            ((auStack_140[uVar7 - 8] >> 7 | auStack_140[uVar7 - 8] << 0x19) ^
             (auStack_140[uVar7 - 8] >> 0x12 | auStack_140[uVar7 - 8] << 0xe) ^
            auStack_140[uVar7 - 8] >> 3) + auStack_140[uVar7 - 9];
    auStack_140[uVar7 + 7] = uVar5;
    iVar2 = auStack_140[0x40] +
            ((uVar4 >> 6 | uVar4 * 0x4000000) ^ (uVar4 >> 0xb | uVar4 * 0x200000) ^
            (uVar4 >> 0x19 | uVar4 * 0x80)) +
            (auStack_140[0x47] ^ uVar4 & (uVar3 ^ auStack_140[0x47])) + uVar1 + uVar5;
    auStack_140[0x44] = iVar2 + auStack_140[0x44];
    auStack_140[0x40] =
         iVar2 + ((auStack_140[0x41] >> 2 | auStack_140[0x41] << 0x1e) ^
                  (auStack_140[0x41] >> 0xd | auStack_140[0x41] << 0x13) ^
                 (auStack_140[0x41] >> 0x16 | auStack_140[0x41] << 10)) +
                 (auStack_140[0x41] & auStack_140[0x42] |
                 auStack_140[0x43] & (auStack_140[0x41] | auStack_140[0x42]));
  }
  for (uVar7 = 0; uVar7 < 8; uVar7 = uVar7 + 1) {
    *(uint *)(in_RDI + 0x48 + (ulong)uVar7 * 4) =
         auStack_140[(ulong)uVar7 + 0x40] + *(int *)(in_RDI + 0x48 + (ulong)uVar7 * 4);
  }
  mbedtls_platform_zeroize
            ((void *)CONCAT44(uVar7,in_stack_fffffffffffffeb0),in_stack_fffffffffffffea8);
  return 0;
}

Assistant:

int mbedtls_internal_sha256_process_c(mbedtls_sha256_context *ctx,
                                      const unsigned char data[SHA256_BLOCK_SIZE])
{
    struct {
        uint32_t temp1, temp2, W[64];
        uint32_t A[8];
    } local;

    unsigned int i;

    for (i = 0; i < 8; i++) {
        local.A[i] = ctx->state[i];
    }

#if defined(MBEDTLS_SHA256_SMALLER)
    for (i = 0; i < 64; i++) {
        if (i < 16) {
            local.W[i] = MBEDTLS_GET_UINT32_BE(data, 4 * i);
        } else {
            R(i);
        }

        P(local.A[0], local.A[1], local.A[2], local.A[3], local.A[4],
          local.A[5], local.A[6], local.A[7], local.W[i], K[i]);

        local.temp1 = local.A[7]; local.A[7] = local.A[6];
        local.A[6] = local.A[5]; local.A[5] = local.A[4];
        local.A[4] = local.A[3]; local.A[3] = local.A[2];
        local.A[2] = local.A[1]; local.A[1] = local.A[0];
        local.A[0] = local.temp1;
    }
#else /* MBEDTLS_SHA256_SMALLER */
    for (i = 0; i < 16; i++) {
        local.W[i] = MBEDTLS_GET_UINT32_BE(data, 4 * i);
    }

    for (i = 0; i < 16; i += 8) {
        P(local.A[0], local.A[1], local.A[2], local.A[3], local.A[4],
          local.A[5], local.A[6], local.A[7], local.W[i+0], K[i+0]);
        P(local.A[7], local.A[0], local.A[1], local.A[2], local.A[3],
          local.A[4], local.A[5], local.A[6], local.W[i+1], K[i+1]);
        P(local.A[6], local.A[7], local.A[0], local.A[1], local.A[2],
          local.A[3], local.A[4], local.A[5], local.W[i+2], K[i+2]);
        P(local.A[5], local.A[6], local.A[7], local.A[0], local.A[1],
          local.A[2], local.A[3], local.A[4], local.W[i+3], K[i+3]);
        P(local.A[4], local.A[5], local.A[6], local.A[7], local.A[0],
          local.A[1], local.A[2], local.A[3], local.W[i+4], K[i+4]);
        P(local.A[3], local.A[4], local.A[5], local.A[6], local.A[7],
          local.A[0], local.A[1], local.A[2], local.W[i+5], K[i+5]);
        P(local.A[2], local.A[3], local.A[4], local.A[5], local.A[6],
          local.A[7], local.A[0], local.A[1], local.W[i+6], K[i+6]);
        P(local.A[1], local.A[2], local.A[3], local.A[4], local.A[5],
          local.A[6], local.A[7], local.A[0], local.W[i+7], K[i+7]);
    }

    for (i = 16; i < 64; i += 8) {
        P(local.A[0], local.A[1], local.A[2], local.A[3], local.A[4],
          local.A[5], local.A[6], local.A[7], R(i+0), K[i+0]);
        P(local.A[7], local.A[0], local.A[1], local.A[2], local.A[3],
          local.A[4], local.A[5], local.A[6], R(i+1), K[i+1]);
        P(local.A[6], local.A[7], local.A[0], local.A[1], local.A[2],
          local.A[3], local.A[4], local.A[5], R(i+2), K[i+2]);
        P(local.A[5], local.A[6], local.A[7], local.A[0], local.A[1],
          local.A[2], local.A[3], local.A[4], R(i+3), K[i+3]);
        P(local.A[4], local.A[5], local.A[6], local.A[7], local.A[0],
          local.A[1], local.A[2], local.A[3], R(i+4), K[i+4]);
        P(local.A[3], local.A[4], local.A[5], local.A[6], local.A[7],
          local.A[0], local.A[1], local.A[2], R(i+5), K[i+5]);
        P(local.A[2], local.A[3], local.A[4], local.A[5], local.A[6],
          local.A[7], local.A[0], local.A[1], R(i+6), K[i+6]);
        P(local.A[1], local.A[2], local.A[3], local.A[4], local.A[5],
          local.A[6], local.A[7], local.A[0], R(i+7), K[i+7]);
    }
#endif /* MBEDTLS_SHA256_SMALLER */

    for (i = 0; i < 8; i++) {
        ctx->state[i] += local.A[i];
    }

    /* Zeroise buffers and variables to clear sensitive data from memory. */
    mbedtls_platform_zeroize(&local, sizeof(local));

    return 0;
}